

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_convolve_y_sr_intrabc_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  uint16_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)w;
  if (w < 1) {
    uVar4 = uVar2;
  }
  if (h < 1) {
    h = 0;
  }
  for (; (int)uVar2 != h; uVar2 = (ulong)((int)uVar2 + 1)) {
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = clip_pixel_highbd((uint)src[uVar3] + (uint)(src + src_stride)[uVar3] + 1 >> 1 & 0xffff
                                ,bd);
      dst[uVar3] = uVar1;
    }
    dst = dst + dst_stride;
    src = src + src_stride;
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_intrabc_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    int bd) {
  assert(subpel_y_qn == 8);
  assert(filter_params_y->taps == 2);
  (void)filter_params_y;
  (void)subpel_y_qn;

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t res = src[x] + src[src_stride + x];
      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(res, 1), bd);
    }
    src += src_stride;
    dst += dst_stride;
  }
}